

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall yy::parser::yy_lac_establish_(parser *this,symbol_kind_type yytoken)

{
  ostream *poVar1;
  symbol_kind_type yysymbol;
  string local_40;
  symbol_kind_type local_1c;
  parser *ppStack_18;
  symbol_kind_type yytoken_local;
  parser *this_local;
  
  if ((this->yy_lac_established_ & 1U) == 0) {
    local_1c = yytoken;
    ppStack_18 = this;
    if (this->yydebug_ != 0) {
      poVar1 = std::operator<<(this->yycdebug_,"LAC: initial context established for ");
      symbol_name_abi_cxx11_(&local_40,(parser *)(ulong)(uint)local_1c,yysymbol);
      poVar1 = std::operator<<(poVar1,(string *)&local_40);
      std::operator<<(poVar1,'\n');
      std::__cxx11::string::~string((string *)&local_40);
    }
    this->yy_lac_established_ = true;
    this_local._7_1_ = yy_lac_check_(this,local_1c);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
  parser::yy_lac_establish_ (symbol_kind_type yytoken)
  {
    /* Establish the initial context for the current lookahead if no initial
       context is currently established.

       We define a context as a snapshot of the parser stacks.  We define
       the initial context for a lookahead as the context in which the
       parser initially examines that lookahead in order to select a
       syntactic action.  Thus, if the lookahead eventually proves
       syntactically unacceptable (possibly in a later context reached via a
       series of reductions), the initial context can be used to determine
       the exact set of tokens that would be syntactically acceptable in the
       lookahead's place.  Moreover, it is the context after which any
       further semantic actions would be erroneous because they would be
       determined by a syntactically unacceptable token.

       yy_lac_establish_ should be invoked when a reduction is about to be
       performed in an inconsistent state (which, for the purposes of LAC,
       includes consistent states that don't know they're consistent because
       their default reductions have been disabled).

       For parse.lac=full, the implementation of yy_lac_establish_ is as
       follows.  If no initial context is currently established for the
       current lookahead, then check if that lookahead can eventually be
       shifted if syntactic actions continue from the current context.  */
    if (yy_lac_established_)
      return true;
    else
      {
#if YYDEBUG
        YYCDEBUG << "LAC: initial context established for "
                 << symbol_name (yytoken) << '\n';
#endif
        yy_lac_established_ = true;
        return yy_lac_check_ (yytoken);
      }
  }